

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.hh
# Opt level: O1

string * __thiscall OB::Parg::print_version_abi_cxx11_(string *__return_storage_ptr__,Parg *this)

{
  pointer pcVar1;
  long lVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_60 [2];
  long local_50 [2];
  long *local_40;
  long local_38;
  long local_30;
  long lStack_28;
  
  pcVar1 = (this->name_)._M_dataplus._M_p;
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,pcVar1,pcVar1 + (this->name_)._M_string_length);
  std::__cxx11::string::append((char *)local_60);
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_60,(ulong)(this->version_)._M_dataplus._M_p);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_30 = *plVar4;
    lStack_28 = plVar3[3];
    local_40 = &local_30;
  }
  else {
    local_30 = *plVar4;
    local_40 = (long *)*plVar3;
  }
  local_38 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_40);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar5) {
    lVar2 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_40 != &local_30) {
    operator_delete(local_40,local_30 + 1);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string print_version() const
  {
    return name_ + " v" + version_ + "\n";
  }